

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_NtkTimeSetDefaultArrival(Abc_Ntk_t *pNtk,float Rise,float Fall)

{
  Abc_ManTime_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    pAVar1 = Abc_ManTimeStart(pNtk);
    pNtk->pManTime = pAVar1;
  }
  pAVar1 = pNtk->pManTime;
  (pAVar1->tArrDef).Rise = Rise;
  (pAVar1->tArrDef).Fall = Fall;
  pVVar2 = pNtk->vCis;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      Abc_NtkTimeSetArrival(pNtk,*(int *)((long)pVVar2->pArray[lVar3] + 0x10),Rise,Fall);
      lVar3 = lVar3 + 1;
      pVVar2 = pNtk->vCis;
    } while (lVar3 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Abc_NtkTimeSetDefaultArrival( Abc_Ntk_t * pNtk, float Rise, float Fall )
{
    Abc_Obj_t * pObj; int i;
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    pNtk->pManTime->tArrDef.Rise  = Rise;
    pNtk->pManTime->tArrDef.Fall  = Fall;
    // set the arrival times for each input
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_NtkTimeSetArrival( pNtk, Abc_ObjId(pObj), Rise, Fall );    
}